

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

RuleInfo * __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::addRule
          (BuildEngineImpl *this,KeyID keyID,
          unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule)

{
  BuildEngineDelegate *pBVar1;
  bool bVar2;
  pointer ppVar3;
  pointer pRVar4;
  string *__rhs;
  pointer this_00;
  type rule_00;
  ulong uVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>,_bool>
  pVar6;
  Twine local_188;
  KeyID local_170;
  undefined1 local_168 [8];
  string error;
  RuleInfo *ruleInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Twine local_100;
  RuleInfo *local_e8;
  RuleInfo *ruleInfo_1;
  undefined1 local_d8;
  ValueTy local_d0;
  RuleInfo local_c8;
  _Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  local_38;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>,_bool>
  result;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule_local;
  BuildEngineImpl *this_local;
  KeyID keyID_local;
  
  local_d0 = keyID._value;
  result._8_8_ = rule;
  this_local = (BuildEngineImpl *)keyID._value;
  RuleInfo::RuleInfo(&local_c8,keyID,rule);
  pVar6 = std::
          unordered_map<llbuild::core::KeyID,(anonymous_namespace)::BuildEngineImpl::RuleInfo,std::hash<llbuild::core::KeyID>,std::equal_to<llbuild::core::KeyID>,std::allocator<std::pair<llbuild::core::KeyID_const,(anonymous_namespace)::BuildEngineImpl::RuleInfo>>>
          ::emplace<llbuild::core::KeyID&,(anonymous_namespace)::BuildEngineImpl::RuleInfo>
                    ((unordered_map<llbuild::core::KeyID,(anonymous_namespace)::BuildEngineImpl::RuleInfo,std::hash<llbuild::core::KeyID>,std::equal_to<llbuild::core::KeyID>,std::allocator<std::pair<llbuild::core::KeyID_const,(anonymous_namespace)::BuildEngineImpl::RuleInfo>>>
                      *)&this->ruleInfos,(KeyID *)&this_local,&local_c8);
  ruleInfo_1 = (RuleInfo *)
               pVar6.first.
               super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
               ._M_cur;
  local_d8 = pVar6.second;
  local_38._M_cur = (__node_type *)ruleInfo_1;
  result.first.
  super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ._M_cur._0_1_ = local_d8;
  RuleInfo::~RuleInfo(&local_c8);
  if (((byte)result.first.
             super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
             ._M_cur & 1) == 0) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
                           *)&local_38);
    local_e8 = &ppVar3->second;
    pBVar1 = this->delegate;
    pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
             operator->(&(ppVar3->second).rule);
    __rhs = llbuild::core::KeyType::str_abi_cxx11_(&pRVar4->key);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ruleInfo,
                   "attempt to register duplicate rule \"",__rhs);
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ruleInfo,
                   "\"\n");
    llvm::Twine::Twine(&local_100,&local_120);
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&ruleInfo);
    std::atomic<bool>::operator=(&this->buildCancelled,true);
    keyID_local._value = (ValueTy)local_e8;
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
                           *)&local_38);
    error.field_2._8_8_ = &ppVar3->second;
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->db);
    if (bVar2) {
      std::__cxx11::string::string((string *)local_168);
      this_00 = std::
                unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::
                operator->(&this->db);
      local_170._value = *(ValueTy *)error.field_2._8_8_;
      rule_00 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                operator*((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                           *)(error.field_2._8_8_ + 8));
      llbuild::core::BuildDB::lookupRuleResult
                (this_00,local_170,rule_00,(Result *)(error.field_2._8_8_ + 0x18),
                 (string *)local_168);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pBVar1 = this->delegate;
        llvm::Twine::Twine(&local_188,(string *)local_168);
        (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_188);
        std::atomic<bool>::operator=(&this->buildCancelled,true);
      }
      std::__cxx11::string::~string((string *)local_168);
    }
    keyID_local._value = error.field_2._8_8_;
  }
  return (RuleInfo *)keyID_local._value;
}

Assistant:

RuleInfo& addRule(KeyID keyID, std::unique_ptr<Rule>&& rule) {
    auto result = ruleInfos.emplace(keyID, RuleInfo(keyID, std::move(rule)));
    if (!result.second) {
      RuleInfo& ruleInfo = result.first->second;
      delegate.error("attempt to register duplicate rule \"" + ruleInfo.rule->key.str() + "\"\n");

      // Set cancelled, but return something 'valid' for use until it is
      // processed.
      buildCancelled = true;
      return ruleInfo;
    }

    // If we have a database attached, retrieve any stored result.
    //
    // FIXME: Investigate retrieving this result lazily. If the DB is
    // particularly efficient, it may be best to retrieve this only when we need
    // it and never duplicate it.
    RuleInfo& ruleInfo = result.first->second;
    if (db) {
      std::string error;
      db->lookupRuleResult(ruleInfo.keyID, *ruleInfo.rule, &ruleInfo.result, &error);
      if (!error.empty()) {
        // FIXME: Investigate changing the database error handling model to
        // allow builds to proceed without the database.
        delegate.error(error);
        buildCancelled = true;
      }
    }

    return ruleInfo;
  }